

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O1

int ddReorderPreprocess(DdManager *table)

{
  int iVar1;
  long lVar2;
  
  cuddCacheFlush(table);
  cuddLocalCacheClearAll(table);
  cuddGarbageCollect(table,0);
  table->isolated = 0;
  if (0 < (long)table->size) {
    lVar2 = 0;
    do {
      if (table->vars[lVar2]->ref == 1) {
        table->isolated = table->isolated + 1;
      }
      lVar2 = lVar2 + 1;
    } while (table->size != lVar2);
  }
  iVar1 = cuddInitInteract(table);
  return (int)(iVar1 != 0);
}

Assistant:

static int
ddReorderPreprocess(
  DdManager * table)
{
    int i;
    int res;

    /* Clear the cache. */
    cuddCacheFlush(table);
    cuddLocalCacheClearAll(table);

    /* Eliminate dead nodes. Do not scan the cache again. */
    cuddGarbageCollect(table,0);

    /* Initialize number of isolated projection functions. */
    table->isolated = 0;
    for (i = 0; i < table->size; i++) {
        if (table->vars[i]->ref == 1) table->isolated++;
    }

    /* Initialize the interaction matrix. */
    res = cuddInitInteract(table);
    if (res == 0) return(0);

    return(1);

}